

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

int __thiscall
baryonyx::itm::compute_order::
infeasibility_local_compute_violated_constraints<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,baryonyx::bit_array>
          (compute_order *this,
          solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
          *solver,bit_array *x)

{
  uint uVar1;
  uint uVar2;
  pointer ppVar3;
  bound_factor *pbVar4;
  int iVar5;
  uint uVar6;
  _Head_base<0UL,_int_*,_false> _Var7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  _Head_base<0UL,_int_*,_false> local_48;
  _Head_base<0UL,_int_*,_false> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  ppVar3 = (this->m_order).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_order).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar3) {
    (this->m_order).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVar3;
  }
  uVar1 = solver->m;
  if ((ulong)uVar1 != 0) {
    uVar8 = 0;
    local_38._M_head_impl = (int *)x;
    do {
      sparse_matrix<int>::row((sparse_matrix<int> *)&local_48,(int)solver + 0x10);
      iVar5 = 0;
      if (local_40._M_head_impl != local_48._M_head_impl) {
        iVar5 = 0;
        _Var7._M_head_impl = local_40._M_head_impl;
        do {
          uVar6 = *_Var7._M_head_impl;
          uVar2 = *(uint *)((long)_Var7._M_head_impl + 4);
          uVar9 = uVar6 + 0x3f;
          if (-1 < (int)uVar6) {
            uVar9 = uVar6;
          }
          uVar11 = uVar2 + 0x3f;
          if (-1 < (int)uVar2) {
            uVar11 = uVar2;
          }
          iVar10 = 0;
          if (((((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
                ((long)local_38._M_head_impl + 8))->_M_t).
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl[(int)uVar11 >> 6] >>
               ((ulong)uVar2 & 0x3f) & 1) != 0) {
            iVar10 = value_bit_array<-1,_1>::return_value
                     [(uint)((solver->A).super_bit_array_impl.m_data._M_t.
                             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                             .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl
                             [(int)uVar9 >> 6] >> ((ulong)uVar6 & 0x3f)) & 1];
          }
          iVar5 = iVar5 + iVar10;
          _Var7._M_head_impl = _Var7._M_head_impl + 8;
        } while (_Var7._M_head_impl != local_48._M_head_impl);
      }
      pbVar4 = (solver->b)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::bound_factor[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::bound_factor[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::bound_factor_*,_false>
               ._M_head_impl;
      if (iVar5 < pbVar4[uVar8].min) {
        uVar6 = pbVar4[uVar8].min - iVar5;
LAB_004bb937:
        local_48._M_head_impl = (int *)((ulong)uVar6 << 0x20 | uVar8);
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->m_order,
                   (pair<int,_int> *)&local_48);
      }
      else if (pbVar4[uVar8].max < iVar5) {
        uVar6 = iVar5 - pbVar4[uVar8].max;
        goto LAB_004bb937;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar1);
  }
  return (int)((ulong)((long)(this->m_order).
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_order).
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3);
}

Assistant:

int infeasibility_local_compute_violated_constraints(Solver& solver,
                                                         const Xtype& x)
    {
        m_order.clear();

        for (int k = 0, e = solver.m; k != e; ++k) {
            sparse_matrix<int>::const_row_iterator it, et;
            std::tie(it, et) = solver.ap.row(k);
            int v = 0;

            for (; it != et; ++it)
                v += solver.factor(it->value) * x[it->column];

            if (solver.bound_min(k) > v)
                m_order.push_back(std::make_pair(k, solver.bound_min(k) - v));
            else if (solver.bound_max(k) < v)
                m_order.push_back(std::make_pair(k, v - solver.bound_max(k)));
        }

        return length(m_order);
    }